

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# life.h
# Opt level: O0

void __thiscall cell_map::set_cell(cell_map *this,int x,int y)

{
  int iVar1;
  byte *pbVar2;
  reference puVar3;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_80;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_78;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_70;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_68;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_60;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_58;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_50;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_48;
  int local_40;
  int local_3c;
  int yobelow;
  int yoabove;
  int xoright;
  int xoleft;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_28;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_20;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  cell_ptr;
  int y_local;
  int x_local;
  cell_map *this_local;
  
  cell_ptr._M_current._0_4_ = y;
  cell_ptr._M_current._4_4_ = x;
  iVar1 = cell_state(this,x,y);
  if (iVar1 == 0) {
    _xoright = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(&this->cells);
    local_28 = __gnu_cxx::
               __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator+((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)&xoright,(long)((int)cell_ptr._M_current * this->width));
    local_20 = __gnu_cxx::
               __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator+(&local_28,(long)cell_ptr._M_current._4_4_);
    if (cell_ptr._M_current._4_4_ == 0) {
      yoabove = this->width + -1;
    }
    else {
      yoabove = -1;
    }
    if ((int)cell_ptr._M_current == 0) {
      local_3c = this->width * (this->height + -1);
    }
    else {
      local_3c = -this->width;
    }
    if (cell_ptr._M_current._4_4_ == this->width + -1) {
      yobelow = -(this->width + -1);
    }
    else {
      yobelow = 1;
    }
    if ((int)cell_ptr._M_current == this->height + -1) {
      local_40 = -this->width * (this->height + -1);
    }
    else {
      local_40 = this->width;
    }
    pbVar2 = __gnu_cxx::
             __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator*(&local_20);
    *pbVar2 = *pbVar2 | 1;
    local_48 = __gnu_cxx::
               __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator+(&local_20,(long)(local_3c + yoabove));
    puVar3 = __gnu_cxx::
             __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator*(&local_48);
    *puVar3 = *puVar3 + '\x02';
    local_50 = __gnu_cxx::
               __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator+(&local_20,(long)local_3c);
    puVar3 = __gnu_cxx::
             __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator*(&local_50);
    *puVar3 = *puVar3 + '\x02';
    local_58 = __gnu_cxx::
               __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator+(&local_20,(long)(local_3c + yobelow));
    puVar3 = __gnu_cxx::
             __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator*(&local_58);
    *puVar3 = *puVar3 + '\x02';
    local_60 = __gnu_cxx::
               __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator+(&local_20,(long)yoabove);
    puVar3 = __gnu_cxx::
             __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator*(&local_60);
    *puVar3 = *puVar3 + '\x02';
    local_68 = __gnu_cxx::
               __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator+(&local_20,(long)yobelow);
    puVar3 = __gnu_cxx::
             __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator*(&local_68);
    *puVar3 = *puVar3 + '\x02';
    local_70 = __gnu_cxx::
               __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator+(&local_20,(long)(local_40 + yoabove));
    puVar3 = __gnu_cxx::
             __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator*(&local_70);
    *puVar3 = *puVar3 + '\x02';
    local_78 = __gnu_cxx::
               __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator+(&local_20,(long)local_40);
    puVar3 = __gnu_cxx::
             __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator*(&local_78);
    *puVar3 = *puVar3 + '\x02';
    local_80 = __gnu_cxx::
               __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator+(&local_20,(long)(local_40 + yobelow));
    puVar3 = __gnu_cxx::
             __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator*(&local_80);
    *puVar3 = *puVar3 + '\x02';
    return;
  }
  __assert_fail("cell_state(x, y) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/life/life.h"
                ,0x1a,"void cell_map::set_cell(int, int)");
}

Assistant:

void set_cell(int x, int y)
    {
    assert(cell_state(x, y) == 0);

    auto cell_ptr = cells.begin() + (y*width) + x;
    int xoleft, xoright, yoabove, yobelow;

    if (x == 0)
      xoleft = width - 1;
    else
      xoleft = -1;
    if (y == 0)
      yoabove = width * (height - 1);
    else
      yoabove = -width;
    if (x == (width - 1))
      xoright = -(width - 1);
    else
      xoright = 1;
    if (y == (height - 1))
      yobelow = -width * (height - 1);
    else
      yobelow = width;

    *(cell_ptr) |= (uint8_t)0x01;
    *(cell_ptr + (yoabove + xoleft)) += 2;
    *(cell_ptr + yoabove) += 2;
    *(cell_ptr + (yoabove + xoright)) += 2;
    *(cell_ptr + xoleft) += 2;
    *(cell_ptr + xoright) += 2;
    *(cell_ptr + (yobelow + xoleft)) += 2;
    *(cell_ptr + yobelow) += 2;
    *(cell_ptr + (yobelow + xoright)) += 2;
    }